

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O3

appender __thiscall
fmt::v8::detail::fallback_formatter<my_type,_char,_void>::format<fmt::v8::appender>
          (fallback_formatter<my_type,_char,_void> *this,my_type *value,
          basic_format_context<fmt::v8::appender,_char> *ctx)

{
  arg_ref<char> ref;
  basic_string_view<char> s;
  basic_string_view<char> s_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  dynamic_format_specs<char> specs;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_format_specs<char> local_288;
  undefined8 local_278;
  char *pcStack_270;
  size_t local_268;
  undefined8 uStack_260;
  char *local_258;
  size_t sStack_250;
  buffer<char> local_240;
  char local_220 [504];
  
  local_240.size_ = 0;
  local_240._vptr_buffer = (_func_int **)&PTR_grow_001594c0;
  local_240.capacity_ = 500;
  local_240.ptr_ = local_220;
  format_value<char,my_type>(&local_240,value,(locale_ref)(ctx->loc_).locale_);
  s_00.size_ = local_240.size_;
  s_00.data_ = local_240.ptr_;
  s.size_ = local_240.size_;
  s.data_ = local_240.ptr_;
  if ((this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.precision_ref.
      kind == none &&
      (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.width_ref.kind ==
      none) {
    bVar1.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   ((ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    ,s,(basic_format_specs<char> *)this,(locale_ref)(ctx->loc_).locale_);
  }
  else {
    local_288.width =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.width;
    local_288.precision =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.precision;
    local_288.type =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.type;
    local_288._9_2_ =
         *(undefined2 *)
          &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
           super_basic_format_specs<char>.field_0x9;
    local_288.fill =
         (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
         super_basic_format_specs<char>.fill;
    local_278 = *(undefined8 *)
                 &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                  width_ref;
    pcStack_270 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                  width_ref.val.name.data_;
    local_268 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                width_ref.val.name.size_;
    uStack_260 = *(undefined8 *)
                  &(this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                   precision_ref;
    local_258 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                precision_ref.val.name.data_;
    sStack_250 = (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
                 precision_ref.val.name.size_;
    handle_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              (&local_288.width,
               (this->super_formatter<fmt::v8::basic_string_view<char>,_char,_void>).specs_.
               width_ref,ctx);
    ref.val.name.data_ = local_258;
    ref._0_8_ = uStack_260;
    ref.val.name.size_ = sStack_250;
    handle_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
              (&local_288.precision,ref,ctx);
    bVar1.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   ((ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    ,s_00,&local_288,(locale_ref)(ctx->loc_).locale_);
  }
  if (local_240.ptr_ != local_220) {
    operator_delete(local_240.ptr_);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar1.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }